

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall JSON::Parser::skipLineComment(Parser *this)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = this->pos;
  lVar4 = (long)iVar3;
  pcVar1 = (this->input)._M_dataplus._M_p;
  if ((pcVar1[lVar4] == '/') && (pcVar1[lVar4 + 1] == '/')) {
    lVar4 = lVar4 + 1;
    this->pos = (int)lVar4;
    iVar3 = iVar3 + 2;
    do {
      if (this->length <= lVar4) {
        return;
      }
      this->pos = iVar3;
      iVar3 = iVar3 + 1;
      lVar2 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while (pcVar1[lVar2] != '\n');
    this->pos = iVar3;
  }
  return;
}

Assistant:

void Parser::skipLineComment() {
        int code = getCodeAt(pos);
        if (code == 47 && getCodeAt(pos + 1) == 47) { // '//'
            pos++;
            while (isValidPos()) {
                code = getCodeAt(++pos);
                if (code == 10) { // '\n'
                    pos++;
                    break;
                }
            }
        }
    }